

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_functions.cpp
# Opt level: O2

void duckdb::EnumRangeBoundaryFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  uint32_t uVar1;
  reference pvVar2;
  Vector *this;
  idx_t iVar3;
  idx_t i;
  ulong index;
  vector<duckdb::LogicalType,_true> types;
  vector<duckdb::Value,_true> enum_values;
  vector<duckdb::Value,_true> local_120;
  LogicalType local_108;
  Value val;
  Value first_param;
  Value second_param;
  
  DataChunk::GetTypes(&types,input);
  DataChunk::GetValue(&first_param,input,0,0);
  DataChunk::GetValue(&second_param,input,1,0);
  pvVar2 = vector<duckdb::LogicalType,_true>::get<true>(&types,(ulong)first_param.is_null);
  this = EnumType::GetValuesInsertOrder(pvVar2);
  if (first_param.is_null == false) {
    uVar1 = Value::GetValue<unsigned_int>(&first_param);
    index = (ulong)uVar1;
  }
  else {
    index = 0;
  }
  if (second_param.is_null == true) {
    pvVar2 = vector<duckdb::LogicalType,_true>::get<true>(&types,0);
    iVar3 = EnumType::GetSize(pvVar2);
  }
  else {
    uVar1 = Value::GetValue<unsigned_int>(&second_param);
    iVar3 = (idx_t)(uVar1 + 1);
  }
  enum_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  enum_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  enum_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (; index < iVar3; index = index + 1) {
    Vector::GetValue(&val,this,index);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&enum_values,&val);
    Value::~Value(&val);
  }
  LogicalType::LogicalType(&local_108,VARCHAR);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_120,
             &enum_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
  Value::LIST(&val,&local_108,&local_120);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_120);
  LogicalType::~LogicalType(&local_108);
  Vector::Reference(result,&val);
  Value::~Value(&val);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&enum_values);
  Value::~Value(&second_param);
  Value::~Value(&first_param);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return;
}

Assistant:

static void EnumRangeBoundaryFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto types = input.GetTypes();
	D_ASSERT(types.size() == 2);
	idx_t start, end;
	auto first_param = input.GetValue(0, 0);
	auto second_param = input.GetValue(1, 0);

	auto &enum_vector =
	    first_param.IsNull() ? EnumType::GetValuesInsertOrder(types[1]) : EnumType::GetValuesInsertOrder(types[0]);

	if (first_param.IsNull()) {
		start = 0;
	} else {
		start = first_param.GetValue<uint32_t>();
	}
	if (second_param.IsNull()) {
		end = EnumType::GetSize(types[0]);
	} else {
		end = second_param.GetValue<uint32_t>() + 1;
	}
	vector<Value> enum_values;
	for (idx_t i = start; i < end; i++) {
		enum_values.emplace_back(enum_vector.GetValue(i));
	}
	auto val = Value::LIST(LogicalType::VARCHAR, enum_values);
	result.Reference(val);
}